

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::OP_NewScIntArray(InterpreterStackFrame *this,OpLayoutAuxiliary *playout)

{
  uint offset;
  FunctionBody *functionBody;
  AuxArray<int> *ints_00;
  JavascriptLibrary *this_00;
  JavascriptArray *this_01;
  SparseArraySegmentBase *segment_00;
  SparseArraySegment<int> *segment;
  JavascriptNativeIntArray *arr;
  AuxArray<int> *ints;
  OpLayoutAuxiliary *playout_local;
  InterpreterStackFrame *this_local;
  
  offset = (playout->super_OpLayoutAuxNoReg).Offset;
  functionBody = GetFunctionBody(this);
  ints_00 = ByteCodeReader::ReadAuxArray<int>(offset,functionBody);
  this_00 = ScriptContext::GetLibrary(*(ScriptContext **)(this + 0x78));
  this_01 = (JavascriptArray *)
            JavascriptLibrary::CreateNativeIntArrayLiteral(this_00,ints_00->count);
  segment_00 = Js::JavascriptArray::GetHead(this_01);
  Js::JavascriptOperators::AddIntsToArraySegment((SparseArraySegment<int> *)segment_00,ints_00);
  Js::JavascriptArray::CheckForceES5Array(this_01);
  SetReg<unsigned_int>(this,playout->R0,this_01);
  return;
}

Assistant:

void InterpreterStackFrame::OP_NewScIntArray(const unaligned OpLayoutAuxiliary * playout)
    {
        const Js::AuxArray<int32> *ints = Js::ByteCodeReader::ReadAuxArray<int32>(playout->Offset, this->GetFunctionBody());

        JavascriptNativeIntArray *arr = scriptContext->GetLibrary()->CreateNativeIntArrayLiteral(ints->count);

        SparseArraySegment<int32> * segment = (SparseArraySegment<int32>*)arr->GetHead();

        JavascriptOperators::AddIntsToArraySegment(segment, ints);

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        arr->CheckForceES5Array();
#endif

        SetReg(playout->R0, arr);
    }